

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_cmov(secp256k1_gej *r,secp256k1_gej *a,int flag)

{
  uint in_EDX;
  secp256k1_fe *in_RSI;
  secp256k1_fe *in_RDI;
  
  secp256k1_gej_verify((secp256k1_gej *)0x13735c);
  secp256k1_gej_verify((secp256k1_gej *)0x137366);
  secp256k1_fe_impl_cmov(in_RDI,in_RSI,in_EDX);
  secp256k1_fe_impl_cmov(in_RDI + 1,in_RSI + 1,in_EDX);
  secp256k1_fe_impl_cmov(in_RDI + 2,in_RSI + 2,in_EDX);
  *(uint *)in_RDI[3].n =
       ((uint)in_RDI[3].n[0] ^ (uint)in_RSI[3].n[0]) & in_EDX ^ (uint)in_RDI[3].n[0];
  secp256k1_gej_verify((secp256k1_gej *)0x1373d8);
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_gej_cmov(secp256k1_gej *r, const secp256k1_gej *a, int flag) {
    SECP256K1_GEJ_VERIFY(r);
    SECP256K1_GEJ_VERIFY(a);

    secp256k1_fe_cmov(&r->x, &a->x, flag);
    secp256k1_fe_cmov(&r->y, &a->y, flag);
    secp256k1_fe_cmov(&r->z, &a->z, flag);
    r->infinity ^= (r->infinity ^ a->infinity) & flag;

    SECP256K1_GEJ_VERIFY(r);
}